

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conversions.cc
# Opt level: O2

void TestStringToDoubleCommentExamples(void)

{
  double dVar1;
  bool *pbVar2;
  int *piVar3;
  bool *pbVar4;
  int in_R9D;
  bool all_used;
  int processed;
  StringToDoubleConverter local_60;
  
  pbVar4 = &all_used;
  pbVar2 = pbVar4;
  dVar1 = StrToD("0x1234",1,0.0,&processed,pbVar4,0);
  CheckEqualsHelper((char *)0xefa,0xc16da9,"StrToD(\"0x1234\", flags, 0.0, &processed, &all_used)",
                    4660.0,pbVar2,dVar1);
  CheckHelper((char *)0xefb,0xc13064,(char *)(ulong)all_used,SUB81(pbVar2,0));
  pbVar2 = pbVar4;
  dVar1 = StrToD("0x1234.56",1,0.0,&processed,pbVar4,0);
  CheckEqualsHelper((char *)0xefe,0xc131a7,
                    "StrToD(\"0x1234.56\", flags, 0.0, &processed, &all_used)",NAN,pbVar2,dVar1);
  CheckEqualsHelper((char *)0xeff,0xc166fe,(char *)0x0,0xc131e4,(char *)(ulong)(uint)processed,
                    in_R9D);
  pbVar2 = pbVar4;
  dVar1 = StrToD("0x1234.56",5,0.0,&processed,pbVar4,0);
  CheckEqualsHelper((char *)0xf03,0xc16da9,
                    "StrToD(\"0x1234.56\", flags, 0.0, &processed, &all_used)",4660.0,pbVar2,dVar1);
  CheckEqualsHelper((char *)0xf04,0xc0e11c,(char *)0x6,0xc131e4,(char *)(ulong)(uint)processed,
                    in_R9D);
  pbVar2 = pbVar4;
  dVar1 = StrToD("01234",2,0.0,&processed,pbVar4,0);
  CheckEqualsHelper((char *)0xf07,0xc16e25,"StrToD(\"01234\", flags, 0.0, &processed, &all_used)",
                    668.0,pbVar2,dVar1);
  CheckHelper((char *)0xf08,0xc13064,(char *)(ulong)all_used,SUB81(pbVar2,0));
  pbVar2 = pbVar4;
  dVar1 = StrToD("012349",2,0.0,&processed,pbVar4,0);
  CheckEqualsHelper((char *)0xf0a,0xc16e5e,"StrToD(\"012349\", flags, 0.0, &processed, &all_used)",
                    12349.0,pbVar2,dVar1);
  CheckHelper((char *)0xf0b,0xc13064,(char *)(ulong)all_used,SUB81(pbVar2,0));
  pbVar2 = pbVar4;
  dVar1 = StrToD("01234.56",2,0.0,&processed,pbVar4,0);
  CheckEqualsHelper((char *)0xf0e,0xc131a7,"StrToD(\"01234.56\", flags, 0.0, &processed, &all_used)"
                    ,NAN,pbVar2,dVar1);
  CheckEqualsHelper((char *)0xf0f,0xc131e4,(char *)(ulong)(uint)processed,0xc166fe,(char *)0x0,
                    in_R9D);
  pbVar2 = pbVar4;
  dVar1 = StrToD("01234.56",6,0.0,&processed,pbVar4,0);
  CheckEqualsHelper((char *)0xf13,0xc16e25,"StrToD(\"01234.56\", flags, 0.0, &processed, &all_used)"
                    ,668.0,pbVar2,dVar1);
  CheckEqualsHelper((char *)0xf14,0xc131e4,(char *)(ulong)(uint)processed,0xc1dc04,(char *)0x5,
                    in_R9D);
  pbVar2 = pbVar4;
  dVar1 = StrToD("-   123.2",0x20,0.0,&processed,pbVar4,0);
  CheckEqualsHelper((char *)0xf17,0xc16ee0,
                    "StrToD(\"-   123.2\", flags, 0.0, &processed, &all_used)",-123.2,pbVar2,dVar1);
  CheckHelper((char *)0xf18,0xc13064,(char *)(ulong)all_used,SUB81(pbVar2,0));
  pbVar2 = pbVar4;
  dVar1 = StrToD("+   123.2",0x20,0.0,&processed,pbVar4,0);
  CheckEqualsHelper((char *)0xf1b,0xc16f63,
                    "StrToD(\"+   123.2\", flags, 0.0, &processed, &all_used)",123.2,pbVar2,dVar1);
  CheckHelper((char *)0xf1c,0xc13064,(char *)(ulong)all_used,SUB81(pbVar2,0));
  pbVar2 = pbVar4;
  dVar1 = StrToD("0x1234",5,0.0,&processed,pbVar4,0);
  CheckEqualsHelper((char *)0xf21,0xc16da9,"StrToD(\"0x1234\", flags, 0.0, &processed, &all_used)",
                    4660.0,pbVar2,dVar1);
  CheckHelper((char *)0xf22,0xc13064,(char *)(ulong)all_used,SUB81(pbVar2,0));
  pbVar2 = pbVar4;
  dVar1 = StrToD("0x1234K",5,0.0,&processed,pbVar4,0);
  CheckEqualsHelper((char *)0xf24,0xc16da9,"StrToD(\"0x1234K\", flags, 0.0, &processed, &all_used)",
                    4660.0,pbVar2,dVar1);
  CheckEqualsHelper((char *)0xf25,0xc131e4,(char *)(ulong)(uint)processed,0xc0e11c,(char *)0x6,
                    in_R9D);
  pbVar2 = pbVar4;
  dVar1 = StrToD("",5,0.0,&processed,pbVar4,0);
  CheckEqualsHelper((char *)0xf27,0xc0f3ce,"StrToD(\"\", flags, 0.0, &processed, &all_used)",0.0,
                    pbVar2,dVar1);
  CheckHelper((char *)0xf28,0xc13064,(char *)(ulong)all_used,SUB81(pbVar2,0));
  pbVar2 = pbVar4;
  dVar1 = StrToD(" ",5,0.0,&processed,pbVar4,0);
  CheckEqualsHelper((char *)0xf2a,0xc131a7,"StrToD(\" \", flags, 0.0, &processed, &all_used)",NAN,
                    pbVar2,dVar1);
  CheckEqualsHelper((char *)0xf2b,0xc131e4,(char *)(ulong)(uint)processed,0xc166fe,(char *)0x0,
                    in_R9D);
  pbVar2 = pbVar4;
  dVar1 = StrToD(" 1",5,0.0,&processed,pbVar4,0);
  CheckEqualsHelper((char *)0xf2d,0xc131a7,"StrToD(\" 1\", flags, 0.0, &processed, &all_used)",NAN,
                    pbVar2,dVar1);
  CheckEqualsHelper((char *)0xf2e,0xc131e4,(char *)(ulong)(uint)processed,0xc166fe,(char *)0x0,
                    in_R9D);
  pbVar2 = pbVar4;
  dVar1 = StrToD("0x",5,0.0,&processed,pbVar4,0);
  CheckEqualsHelper((char *)0xf30,0xc131a7,"StrToD(\"0x\", flags, 0.0, &processed, &all_used)",NAN,
                    pbVar2,dVar1);
  CheckEqualsHelper((char *)0xf31,0xc131e4,(char *)(ulong)(uint)processed,0xc166fe,(char *)0x0,
                    in_R9D);
  pbVar2 = pbVar4;
  dVar1 = StrToD("-123.45",5,0.0,&processed,pbVar4,0);
  CheckEqualsHelper((char *)0xf33,0xc17042,"StrToD(\"-123.45\", flags, 0.0, &processed, &all_used)",
                    -123.45,pbVar2,dVar1);
  CheckHelper((char *)0xf34,0xc13064,(char *)(ulong)all_used,SUB81(pbVar2,0));
  pbVar2 = pbVar4;
  dVar1 = StrToD("--123.45",5,0.0,&processed,pbVar4,0);
  CheckEqualsHelper((char *)0xf37,0xc131a7,"StrToD(\"--123.45\", flags, 0.0, &processed, &all_used)"
                    ,NAN,pbVar2,dVar1);
  CheckEqualsHelper((char *)0xf38,0xc131e4,(char *)(ulong)(uint)processed,0xc166fe,(char *)0x0,
                    in_R9D);
  pbVar2 = pbVar4;
  dVar1 = StrToD("123e45",5,0.0,&processed,pbVar4,0);
  CheckEqualsHelper((char *)0xf3a,0xc1719d,"StrToD(\"123e45\", flags, 0.0, &processed, &all_used)",
                    1.23e+47,pbVar2,dVar1);
  CheckHelper((char *)0xf3b,0xc13064,(char *)(ulong)all_used,SUB81(pbVar2,0));
  pbVar2 = pbVar4;
  dVar1 = StrToD("123E45",5,0.0,&processed,pbVar4,0);
  CheckEqualsHelper((char *)0xf3d,0xc1719d,"StrToD(\"123E45\", flags, 0.0, &processed, &all_used)",
                    1.23e+47,pbVar2,dVar1);
  CheckHelper((char *)0xf3e,0xc13064,(char *)(ulong)all_used,SUB81(pbVar2,0));
  pbVar2 = pbVar4;
  dVar1 = StrToD("123e+45",5,0.0,&processed,pbVar4,0);
  CheckEqualsHelper((char *)0xf40,0xc1719d,"StrToD(\"123e+45\", flags, 0.0, &processed, &all_used)",
                    1.23e+47,pbVar2,dVar1);
  CheckHelper((char *)0xf41,0xc13064,(char *)(ulong)all_used,SUB81(pbVar2,0));
  pbVar2 = pbVar4;
  dVar1 = StrToD("123e-45",5,0.0,&processed,pbVar4,0);
  CheckEqualsHelper((char *)0xf43,0xc170f6,"StrToD(\"123e-45\", flags, 0.0, &processed, &all_used)",
                    1.23e-43,pbVar2,dVar1);
  CheckHelper((char *)0xf44,0xc13064,(char *)(ulong)all_used,SUB81(pbVar2,0));
  pbVar2 = pbVar4;
  dVar1 = StrToD("123e",5,0.0,&processed,pbVar4,0);
  CheckEqualsHelper((char *)0xf46,0xc0f7b2,"StrToD(\"123e\", flags, 0.0, &processed, &all_used)",
                    123.0,pbVar2,dVar1);
  CheckEqualsHelper((char *)0xf47,0xc131e4,(char *)(ulong)(uint)processed,0xc13999,(char *)0x3,
                    in_R9D);
  dVar1 = StrToD("123e-",5,0.0,&processed,pbVar4,0);
  CheckEqualsHelper((char *)0xf49,0xc0f7b2,"StrToD(\"123e-\", flags, 0.0, &processed, &all_used)",
                    123.0,pbVar4,dVar1);
  CheckEqualsHelper((char *)0xf4a,0xc131e4,(char *)(ulong)(uint)processed,0xc13999,(char *)0x3,
                    in_R9D);
  local_60.flags_ = 5;
  local_60.empty_string_value_._0_4_ = 0;
  local_60.empty_string_value_._4_4_ = 0;
  local_60.junk_string_value_._0_4_ = 0;
  local_60.junk_string_value_._4_4_ = 0x3ff00000;
  local_60.infinity_symbol_ = "infinity";
  local_60.nan_symbol_ = "NaN";
  local_60.separator_ = 0;
  piVar3 = &processed;
  dVar1 = double_conversion::StringToDoubleConverter::StringToDouble(&local_60,"+NaN",4,&processed);
  CheckEqualsHelper((char *)0xf4e,0xc131a7,"converter.StringToDouble(\"+NaN\", 4, &processed)",NAN,
                    (char *)piVar3,dVar1);
  CheckEqualsHelper((char *)0xf4f,0xc17291,(char *)0x4,0xc131e4,(char *)(ulong)(uint)processed,
                    in_R9D);
  piVar3 = &processed;
  dVar1 = double_conversion::StringToDoubleConverter::StringToDouble
                    (&local_60,"-infinity",9,&processed);
  CheckEqualsHelper((char *)0xf52,0xc16c75,"converter.StringToDouble(\"-infinity\", 9, &processed)",
                    -INFINITY,(char *)piVar3,dVar1);
  CheckEqualsHelper((char *)0xf53,0xc16455,(char *)0x9,0xc131e4,(char *)(ulong)(uint)processed,
                    in_R9D);
  piVar3 = &processed;
  dVar1 = double_conversion::StringToDoubleConverter::StringToDouble
                    (&local_60,"Infinity",9,&processed);
  CheckEqualsHelper((char *)0xf55,0xc15d9d,"converter.StringToDouble(\"Infinity\", 9, &processed)",
                    1.0,(char *)piVar3,dVar1);
  CheckEqualsHelper((char *)0xf56,0xc166fe,(char *)0x0,0xc131e4,(char *)(ulong)(uint)processed,
                    in_R9D);
  pbVar4 = &all_used;
  pbVar2 = pbVar4;
  dVar1 = StrToD("0x1234",10,0.0,&processed,pbVar4,0);
  CheckEqualsHelper((char *)0xf5c,0xc131a7,"StrToD(\"0x1234\", flags, 0.0, &processed, &all_used)",
                    NAN,pbVar2,dVar1);
  CheckEqualsHelper((char *)0xf5d,0xc166fe,(char *)0x0,0xc131e4,(char *)(ulong)(uint)processed,
                    in_R9D);
  pbVar2 = pbVar4;
  dVar1 = StrToD("01234",10,0.0,&processed,pbVar4,0);
  CheckEqualsHelper((char *)0xf5f,0xc16e25,"StrToD(\"01234\", flags, 0.0, &processed, &all_used)",
                    668.0,pbVar2,dVar1);
  CheckHelper((char *)0xf60,0xc13064,(char *)(ulong)all_used,SUB81(pbVar2,0));
  pbVar2 = pbVar4;
  dVar1 = StrToD("",10,0.0,&processed,pbVar4,0);
  CheckEqualsHelper((char *)0xf62,0xc0f3ce,"StrToD(\"\", flags, 0.0, &processed, &all_used)",0.0,
                    pbVar2,dVar1);
  CheckHelper((char *)0xf63,0xc13064,(char *)(ulong)all_used,SUB81(pbVar2,0));
  pbVar2 = pbVar4;
  dVar1 = StrToD(" ",10,0.0,&processed,pbVar4,0);
  CheckEqualsHelper((char *)0xf65,0xc0f3ce,"StrToD(\" \", flags, 0.0, &processed, &all_used)",0.0,
                    pbVar2,dVar1);
  CheckHelper((char *)0xf66,0xc13064,(char *)(ulong)all_used,SUB81(pbVar2,0));
  pbVar2 = pbVar4;
  dVar1 = StrToD(" 1",10,0.0,&processed,pbVar4,0);
  CheckEqualsHelper((char *)0xf68,0xc15d9d,"StrToD(\" 1\", flags, 0.0, &processed, &all_used)",1.0,
                    pbVar2,dVar1);
  CheckHelper((char *)0xf69,0xc13064,(char *)(ulong)all_used,SUB81(pbVar2,0));
  pbVar2 = pbVar4;
  dVar1 = StrToD("0x",10,0.0,&processed,pbVar4,0);
  CheckEqualsHelper((char *)0xf6b,0xc131a7,"StrToD(\"0x\", flags, 0.0, &processed, &all_used)",NAN,
                    pbVar2,dVar1);
  CheckEqualsHelper((char *)0xf6c,0xc166fe,(char *)0x0,0xc131e4,(char *)(ulong)(uint)processed,
                    in_R9D);
  pbVar2 = pbVar4;
  dVar1 = StrToD("0123e45",10,0.0,&processed,pbVar4,0);
  CheckEqualsHelper((char *)0xf6e,0xc131a7,"StrToD(\"0123e45\", flags, 0.0, &processed, &all_used)",
                    NAN,pbVar2,dVar1);
  CheckEqualsHelper((char *)0xf6f,0xc166fe,(char *)0x0,0xc131e4,(char *)(ulong)(uint)processed,
                    in_R9D);
  pbVar2 = pbVar4;
  dVar1 = StrToD("01239e45",10,0.0,&processed,pbVar4,0);
  CheckEqualsHelper((char *)0xf71,0xc171db,"StrToD(\"01239e45\", flags, 0.0, &processed, &all_used)"
                    ,1.239e+48,pbVar2,dVar1);
  CheckHelper((char *)0xf72,0xc13064,(char *)(ulong)all_used,SUB81(pbVar2,0));
  pbVar2 = pbVar4;
  dVar1 = StrToD("-infinity",10,0.0,&processed,pbVar4,0);
  CheckEqualsHelper((char *)0xf75,0xc131a7,
                    "StrToD(\"-infinity\", flags, 0.0, &processed, &all_used)",NAN,pbVar2,dVar1);
  CheckEqualsHelper((char *)0xf76,0xc166fe,(char *)0x0,0xc131e4,(char *)(ulong)(uint)processed,
                    in_R9D);
  pbVar2 = pbVar4;
  dVar1 = StrToD("NaN",10,0.0,&processed,pbVar4,0);
  CheckEqualsHelper((char *)0xf78,0xc131a7,"StrToD(\"NaN\", flags, 0.0, &processed, &all_used)",NAN,
                    pbVar2,dVar1);
  CheckEqualsHelper((char *)0xf79,0xc166fe,(char *)0x0,0xc131e4,(char *)(ulong)(uint)processed,
                    in_R9D);
  pbVar2 = pbVar4;
  dVar1 = StrToD("1 2 3 4",0,0.0,&processed,pbVar4,0x20);
  CheckEqualsHelper((char *)0xf7e,0xc1dd9a,
                    "StrToD(\"1 2 3 4\", flags, 0.0, &processed, &all_used, separator)",1234.0,
                    pbVar2,dVar1);
  CheckHelper((char *)0xf7f,0xc13064,(char *)(ulong)all_used,SUB81(pbVar2,0));
  pbVar2 = pbVar4;
  dVar1 = StrToD("1  2",0,0.0,&processed,pbVar4,0x20);
  CheckEqualsHelper((char *)0xf82,0xc131a7,
                    "StrToD(\"1  2\", flags, 0.0, &processed, &all_used, separator)",NAN,pbVar2,
                    dVar1);
  CheckEqualsHelper((char *)0xf83,0xc166fe,(char *)0x0,0xc131e4,(char *)(ulong)(uint)processed,
                    in_R9D);
  pbVar2 = pbVar4;
  dVar1 = StrToD("1 000 000.0",0,0.0,&processed,pbVar4,0x20);
  CheckEqualsHelper((char *)0xf86,0xc172d5,
                    "StrToD(\"1 000 000.0\", flags, 0.0, &processed, &all_used, separator)",
                    1000000.0,pbVar2,dVar1);
  CheckHelper((char *)0xf87,0xc13064,(char *)(ulong)all_used,SUB81(pbVar2,0));
  pbVar2 = pbVar4;
  dVar1 = StrToD("1.000 000",0,0.0,&processed,pbVar4,0x20);
  CheckEqualsHelper((char *)0xf8a,0xc15d9d,
                    "StrToD(\"1.000 000\", flags, 0.0, &processed, &all_used, separator)",1.0,pbVar2
                    ,dVar1);
  CheckHelper((char *)0xf8b,0xc13064,(char *)(ulong)all_used,SUB81(pbVar2,0));
  dVar1 = StrToD("1.0e1 000",0,0.0,&processed,pbVar4,0x20);
  CheckEqualsHelper((char *)0xf8e,0xc131a7,
                    "StrToD(\"1.0e1 000\", flags, 0.0, &processed, &all_used, separator)",NAN,pbVar4
                    ,dVar1);
  CheckEqualsHelper((char *)0xf8f,0xc166fe,(char *)0x0,0xc131e4,(char *)(ulong)(uint)processed,
                    in_R9D);
  return;
}

Assistant:

TEST(StringToDoubleCommentExamples) {
  // Make sure the examples in the comments are correct.
  int flags;
  int processed;
  bool all_used;

  flags = StringToDoubleConverter::ALLOW_HEX;

  CHECK_EQ(4660.0, StrToD("0x1234", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(),
           StrToD("0x1234.56", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  flags |= StringToDoubleConverter::ALLOW_TRAILING_JUNK;
  CHECK_EQ(4660.0,
           StrToD("0x1234.56", flags, 0.0, &processed, &all_used));
  CHECK_EQ(6, processed);

  flags = StringToDoubleConverter::ALLOW_OCTALS;
  CHECK_EQ(668.0, StrToD("01234", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(12349.0, StrToD("012349", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(),
           StrToD("01234.56", flags, 0.0, &processed, &all_used));
  CHECK_EQ(processed, 0);

  flags |= StringToDoubleConverter::ALLOW_TRAILING_JUNK;
  CHECK_EQ(668.0,
           StrToD("01234.56", flags, 0.0, &processed, &all_used));
  CHECK_EQ(processed, 5);

  flags  = StringToDoubleConverter::ALLOW_SPACES_AFTER_SIGN;
  CHECK_EQ(-123.2, StrToD("-   123.2", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  flags  = StringToDoubleConverter::ALLOW_SPACES_AFTER_SIGN;
  CHECK_EQ(123.2, StrToD("+   123.2", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  flags = StringToDoubleConverter::ALLOW_HEX |
      StringToDoubleConverter::ALLOW_TRAILING_JUNK;

  CHECK_EQ(4660.0, StrToD("0x1234", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(4660.0, StrToD("0x1234K", flags, 0.0, &processed, &all_used));
  CHECK_EQ(processed, 6);

  CHECK_EQ(0.0, StrToD("", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToD(" ", flags, 0.0, &processed, &all_used));
  CHECK_EQ(processed, 0);

  CHECK_EQ(Double::NaN(), StrToD(" 1", flags, 0.0, &processed, &all_used));
  CHECK_EQ(processed, 0);

  CHECK_EQ(Double::NaN(), StrToD("0x", flags, 0.0, &processed, &all_used));
  CHECK_EQ(processed, 0);

  CHECK_EQ(-123.45, StrToD("-123.45", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(),
           StrToD("--123.45", flags, 0.0, &processed, &all_used));
  CHECK_EQ(processed, 0);

  CHECK_EQ(123e45, StrToD("123e45", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(123e45, StrToD("123E45", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(123e45, StrToD("123e+45", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(123e-45, StrToD("123e-45", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(123.0, StrToD("123e", flags, 0.0, &processed, &all_used));
  CHECK_EQ(processed, 3);

  CHECK_EQ(123.0, StrToD("123e-", flags, 0.0, &processed, &all_used));
  CHECK_EQ(processed, 3);

  {
    StringToDoubleConverter converter(flags, 0.0, 1.0, "infinity", "NaN");
    CHECK_EQ(Double::NaN(), converter.StringToDouble("+NaN", 4, &processed));
    CHECK_EQ(4, processed);

    CHECK_EQ(-Double::Infinity(),
             converter.StringToDouble("-infinity", 9, &processed));
    CHECK_EQ(9, processed);

    CHECK_EQ(1.0, converter.StringToDouble("Infinity", 9, &processed));
    CHECK_EQ(0, processed);
  }

  flags = StringToDoubleConverter::ALLOW_OCTALS |
      StringToDoubleConverter::ALLOW_LEADING_SPACES;

  CHECK_EQ(Double::NaN(), StrToD("0x1234", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(668.0, StrToD("01234", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(0.0, StrToD("", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(0.0, StrToD(" ", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(1.0, StrToD(" 1", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToD("0x", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("0123e45", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(1239e45, StrToD("01239e45", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(),
           StrToD("-infinity", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("NaN", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  flags = StringToDoubleConverter::NO_FLAGS;
  char separator = ' ';
  CHECK_EQ(1234.0,
           StrToD("1 2 3 4", flags, 0.0, &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(),
           StrToD("1  2", flags, 0.0, &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(1000000.0,
           StrToD("1 000 000.0", flags, 0.0, &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(1.0,
           StrToD("1.000 000", flags, 0.0, &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(),
           StrToD("1.0e1 000", flags, 0.0, &processed, &all_used, separator));
  CHECK_EQ(0, processed);
}